

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger default_delegate_tofloat(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  long lVar2;
  bool bVar3;
  SQObjectPtr *pSVar4;
  SQRESULT SVar5;
  SQObjectPtr res;
  SQObjectPtr local_28;
  SQObjectPtr local_18;
  
  pSVar4 = SQVM::GetAt(v,v->_stackbase);
  SVar1 = (pSVar4->super_SQObject)._type;
  if ((int)SVar1 < 0x5000004) {
    if (SVar1 == OT_BOOL) {
      if ((pSVar4->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
        local_28.super_SQObject._unVal.fFloat = (SQFloat)0;
      }
      else {
        local_28.super_SQObject._unVal.fFloat = (SQFloat)0x3f800000;
      }
      local_28.super_SQObject._type = OT_FLOAT;
      local_28.super_SQObject._unVal.nInteger._4_4_ = 0;
      SQVM::Push(v,&local_28);
      goto LAB_001169d2;
    }
    if (SVar1 != OT_INTEGER) {
LAB_00116923:
      SQVM::PushNull(v);
      return 1;
    }
  }
  else if (SVar1 != OT_FLOAT) {
    if (SVar1 != OT_STRING) goto LAB_00116923;
    local_28.super_SQObject._type = OT_NULL;
    local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
    bVar3 = str2num(((pSVar4->super_SQObject)._unVal.pString)->_val,&local_28,10);
    if (!bVar3) {
      SQObjectPtr::~SQObjectPtr(&local_28);
      SVar5 = sq_throwerror(v,"cannot convert the string");
      return SVar5;
    }
    if (local_28.super_SQObject._type == OT_INTEGER) {
      local_18.super_SQObject._unVal.fFloat = (SQFloat)local_28.super_SQObject._unVal.nInteger;
    }
    else {
      local_18.super_SQObject._unVal.fFloat = local_28.super_SQObject._unVal.fFloat;
    }
    local_18.super_SQObject._type = OT_FLOAT;
    local_18.super_SQObject._unVal.nInteger._4_4_ = 0;
    SQVM::Push(v,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
    goto LAB_001169d2;
  }
  lVar2 = (pSVar4->super_SQObject)._unVal.nInteger;
  if (SVar1 == OT_INTEGER) {
    local_28.super_SQObject._unVal.fFloat = (SQFloat)lVar2;
  }
  else {
    local_28.super_SQObject._unVal.fFloat = (SQFloat)(int)lVar2;
  }
  local_28.super_SQObject._type = OT_FLOAT;
  local_28.super_SQObject._unVal.nInteger._4_4_ = 0;
  SQVM::Push(v,&local_28);
LAB_001169d2:
  SQObjectPtr::~SQObjectPtr(&local_28);
  return 1;
}

Assistant:

static SQInteger default_delegate_tofloat(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,10)){
            v->Push(SQObjectPtr(tofloat(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tofloat(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr((SQFloat)(_integer(o)?1:0)));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}